

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O0

duration __thiscall
so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>::
distribute_current_data(stats_controller_t<so_5::details::no_lock_holder_t> *this)

{
  type tVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  source_t *local_28;
  source_t *s;
  time_point started_at;
  stats_controller_t<so_5::details::no_lock_holder_t> *this_local;
  
  started_at.__d.__r = (duration)(duration)this;
  s = (source_t *)std::chrono::_V2::steady_clock::now();
  send<so_5::stats::messages::distribution_started,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&>
            (&this->m_distribution_mbox);
  for (local_28 = this->m_head; local_28 != (source_t *)0x0;
      local_28 = stats::repository_t::source_list_next(local_28)) {
    (**local_28->_vptr_source_t)(local_28,&this->m_distribution_mbox);
  }
  send<so_5::stats::messages::distribution_finished,so_5::intrusive_ptr_t<so_5::abstract_message_box_t>const&>
            (&this->m_distribution_mbox);
  local_30.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  tVar1 = std::chrono::operator-
                    (&local_30,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&s);
  return (duration)tVar1.__r;
}

Assistant:

std::chrono::steady_clock::duration
		distribute_current_data()
			{
				auto started_at = std::chrono::steady_clock::now();

				send< so_5::stats::messages::distribution_started >(
						m_distribution_mbox );

				auto s = m_head;
				while( s )
					{
						s->distribute( m_distribution_mbox );

						s = source_list_next( *s );
					}

				send< so_5::stats::messages::distribution_finished >(
						m_distribution_mbox );

				return std::chrono::steady_clock::now() - started_at;
			}